

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt_long(int argc,char **argv,char *optstring,option *longopts,int *longindex)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_60;
  int local_5c;
  int retval;
  char *current_argument;
  size_t argument_name_length;
  option *poStack_40;
  int num_matches;
  option *match;
  option *o;
  int *longindex_local;
  option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  poStack_40 = (option *)0x0;
  argument_name_length._4_4_ = 0;
  optarg = (char *)0x0;
  optopt = 0;
  if (optind < argc) {
    sVar2 = strlen(argv[optind]);
    if ((sVar2 < 3) || (iVar1 = strncmp(argv[optind],"--",2), iVar1 != 0)) {
      argv_local._4_4_ = getopt(argc,argv,optstring);
    }
    else {
      pcVar3 = argv[optind];
      sVar2 = strcspn(pcVar3 + 2,"=");
      for (match = longopts; match->name != (char *)0x0; match = match + 1) {
        iVar1 = strncmp(match->name,pcVar3 + 2,sVar2);
        if (iVar1 == 0) {
          poStack_40 = match;
          argument_name_length._4_4_ = argument_name_length._4_4_ + 1;
        }
      }
      if (argument_name_length._4_4_ == 1) {
        if (longindex != (int *)0x0) {
          *longindex = (int)((long)poStack_40 - (long)longopts >> 5);
        }
        if (poStack_40->flag != (int *)0x0) {
          *poStack_40->flag = poStack_40->val;
        }
        if (poStack_40->flag == (int *)0x0) {
          local_60 = poStack_40->val;
        }
        else {
          local_60 = 0;
        }
        local_5c = local_60;
        if (poStack_40->has_arg == 0) {
          pcVar3 = strchr(argv[optind],0x3d);
          if (pcVar3 != (char *)0x0) {
            local_5c = 0x3f;
          }
        }
        else {
          optarg = strchr(argv[optind],0x3d);
          if (optarg != (char *)0x0) {
            optarg = optarg + 1;
          }
          if (poStack_40->has_arg == 1) {
            if ((optarg == (char *)0x0) && (optind = optind + 1, optind < argc)) {
              optarg = argv[optind];
            }
            if (optarg == (char *)0x0) {
              local_5c = 0x3a;
            }
          }
        }
      }
      else {
        local_5c = 0x3f;
      }
      optind = optind + 1;
      argv_local._4_4_ = local_5c;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int getopt_long(int argc, char* const argv[], const char* optstring,
  const struct option* longopts, int* longindex) {
  const struct option* o = longopts;
  const struct option* match = NULL;
  int num_matches = 0;
  size_t argument_name_length = 0;
  const char* current_argument = NULL;
  int retval = -1;

  optarg = NULL;
  optopt = 0;

  if (optind >= argc)
    return -1;

  if (strlen(argv[optind]) < 3 || strncmp(argv[optind], "--", 2) != 0)
    return getopt(argc, argv, optstring);

  /* It's an option; starts with -- and is longer than two chars. */
  current_argument = argv[optind] + 2;
  argument_name_length = strcspn(current_argument, "=");
  for (; o->name; ++o) {
    if (strncmp(o->name, current_argument, argument_name_length) == 0) {
      match = o;
      ++num_matches;
    }
  }

  if (num_matches == 1) {
    /* If longindex is not NULL, it points to a variable which is set to the
       index of the long option relative to longopts. */
    if (longindex)
      *longindex = (int) (match - longopts);

    /* If flag is NULL, then getopt_long() shall return val.
       Otherwise, getopt_long() returns 0, and flag shall point to a variable
       which shall be set to val if the option is found, but left unchanged if
       the option is not found. */
    if (match->flag)
      *(match->flag) = match->val;

    retval = match->flag ? 0 : match->val;

    if (match->has_arg != no_argument) {
      optarg = strchr(argv[optind], '=');
      if (optarg != NULL)
        ++optarg;

      if (match->has_arg == required_argument) {
        /* Only scan the next argv for required arguments. Behavior is not
           specified, but has been observed with Ubuntu and Mac OSX. */
        if (optarg == NULL && ++optind < argc) {
          optarg = argv[optind];
        }

        if (optarg == NULL)
          retval = ':';
      }
    } else if (strchr(argv[optind], '=')) {
      /* An argument was provided to a non-argument option.
         I haven't seen this specified explicitly, but both GNU and BSD-based
         implementations show this behavior.
      */
      retval = '?';
    }
  } else {
    /* Unknown option or ambiguous match. */
    retval = '?';
  }

  ++optind;
  return retval;
}